

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry3D.cpp
# Opt level: O3

void __thiscall Assimp::X3DImporter::ParseNode_Geometry3D_Extrusion(X3DImporter *this)

{
  size_t *psVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  float fVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined8 uVar18;
  undefined4 uVar24;
  undefined4 uVar25;
  float fVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  FIReader *pFVar35;
  char *pcVar36;
  CX3DImporter_NodeElement *pCVar37;
  pointer paVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar41;
  ulong uVar42;
  X3DImporter *pXVar43;
  bool bVar44;
  uint uVar45;
  int iVar46;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  _List_node_base *p_Var47;
  runtime_error *prVar48;
  long lVar49;
  long lVar50;
  ulong uVar51;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pValue;
  string *psVar52;
  ulong uVar53;
  byte bVar54;
  float *pfVar55;
  long lVar56;
  iterator iVar57;
  ulong uVar58;
  long lVar59;
  float *pfVar60;
  long lVar61;
  pointer paVar62;
  byte bVar63;
  int iVar64;
  uint uVar65;
  uint uVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  uint uVar73;
  uint uVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  string an;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> spine;
  vector<float,_std::allocator<float>_> orientation;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> crossSection;
  CX3DImporter_NodeElement *ne;
  vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_> basis_arr;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> scale;
  vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
  pointset_arr;
  string def;
  string use;
  bool local_20a;
  bool local_209;
  undefined1 local_208 [4];
  float fStack_204;
  aiVector2t<float> aStack_200;
  undefined1 local_1f8 [28];
  undefined4 local_1dc;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_1d8;
  float local_1bc;
  vector<float,_std::allocator<float>_> local_1b8;
  undefined8 local_1a0;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> local_198;
  X3DImporter *local_178;
  ulong local_170;
  CX3DImporter_NodeElement *local_168;
  allocator_type local_159;
  undefined8 local_158;
  float fStack_150;
  float fStack_14c;
  vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_> local_148;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> local_128;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  ulong local_f8;
  float local_f0;
  float local_ec;
  float local_e8;
  float local_e4;
  float local_e0;
  float local_dc;
  undefined1 local_d8 [16];
  pointer local_c8;
  undefined8 local_b8;
  float fStack_b0;
  float fStack_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  uint uStack_90;
  uint uStack_8c;
  string local_88;
  string local_68;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined4 extraout_var_00;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_198.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_128.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector2t<float> *)0x0;
  local_128.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector2t<float> *)0x0;
  local_128.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector2t<float> *)0x0;
  local_1d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168 = (CX3DImporter_NodeElement *)0x0;
  uVar45 = (*(((this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
             super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  local_178 = this;
  if ((int)uVar45 < 1) {
    local_108 = 0.0;
    bVar54 = 1;
    local_20a = true;
    bVar63 = 1;
    local_170 = CONCAT71(local_170._1_7_,1);
    local_209 = true;
  }
  else {
    uVar51 = 0;
    local_108 = 0.0;
    local_209 = true;
    local_170 = CONCAT71(local_170._1_7_,1);
    local_158 = CONCAT71(local_158._1_7_,1);
    local_20a = true;
    local_1a0 = CONCAT71(local_1a0._1_7_,1);
    do {
      pFVar35 = (this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      iVar64 = (int)uVar51;
      iVar46 = (*(pFVar35->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                         (pFVar35,uVar51);
      std::__cxx11::string::string
                ((string *)local_208,(char *)CONCAT44(extraout_var,iVar46),(allocator *)&local_148);
      iVar46 = std::__cxx11::string::compare((char *)local_208);
      if (iVar46 == 0) {
        iVar46 = (*(((this->mReader)._M_t.
                     super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                     .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                   super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar46);
        psVar52 = &local_88;
LAB_00689076:
        pcVar36 = (char *)psVar52->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar52,0,pcVar36,(ulong)__s);
        this = local_178;
      }
      else {
        iVar46 = std::__cxx11::string::compare((char *)local_208);
        if (iVar46 == 0) {
          iVar46 = (*(((this->mReader)._M_t.
                       super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                       .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                     super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar46);
          psVar52 = &local_68;
          goto LAB_00689076;
        }
        iVar46 = std::__cxx11::string::compare((char *)local_208);
        if (((iVar46 != 0) &&
            (iVar46 = std::__cxx11::string::compare((char *)local_208), iVar46 != 0)) &&
           (iVar46 = std::__cxx11::string::compare((char *)local_208), iVar46 != 0)) {
          iVar46 = std::__cxx11::string::compare((char *)local_208);
          if (iVar46 == 0) {
            local_209 = XML_ReadNode_GetAttrVal_AsBool(this,iVar64);
          }
          else {
            iVar46 = std::__cxx11::string::compare((char *)local_208);
            if (iVar46 == 0) {
              bVar44 = XML_ReadNode_GetAttrVal_AsBool(this,iVar64);
              local_170 = CONCAT71(local_170._1_7_,bVar44);
            }
            else {
              iVar46 = std::__cxx11::string::compare((char *)local_208);
              if (iVar46 == 0) {
                bVar44 = XML_ReadNode_GetAttrVal_AsBool(this,iVar64);
                local_158 = CONCAT71(local_158._1_7_,bVar44);
              }
              else {
                iVar46 = std::__cxx11::string::compare((char *)local_208);
                if (iVar46 == 0) {
                  local_108 = XML_ReadNode_GetAttrVal_AsFloat(this,iVar64);
                }
                else {
                  iVar46 = std::__cxx11::string::compare((char *)local_208);
                  pValue = &local_198;
                  if (iVar46 == 0) {
LAB_00689114:
                    XML_ReadNode_GetAttrVal_AsArrVec2f(this,iVar64,pValue);
                  }
                  else {
                    iVar46 = std::__cxx11::string::compare((char *)local_208);
                    if (iVar46 == 0) {
                      local_20a = XML_ReadNode_GetAttrVal_AsBool(this,iVar64);
                    }
                    else {
                      iVar46 = std::__cxx11::string::compare((char *)local_208);
                      if (iVar46 == 0) {
                        XML_ReadNode_GetAttrVal_AsArrF(this,iVar64,&local_1b8);
                      }
                      else {
                        iVar46 = std::__cxx11::string::compare((char *)local_208);
                        pValue = &local_128;
                        if (iVar46 == 0) goto LAB_00689114;
                        iVar46 = std::__cxx11::string::compare((char *)local_208);
                        if (iVar46 == 0) {
                          bVar44 = XML_ReadNode_GetAttrVal_AsBool(this,iVar64);
                          local_1a0 = CONCAT71(local_1a0._1_7_,bVar44);
                        }
                        else {
                          iVar46 = std::__cxx11::string::compare((char *)local_208);
                          if (iVar46 == 0) {
                            XML_ReadNode_GetAttrVal_AsArrVec3f(this,iVar64,&local_1d8);
                          }
                          else {
                            Throw_IncorrectAttr(this,(string *)local_208);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if (_local_208 != (aiVector2t<float>)local_1f8) {
        operator_delete((void *)_local_208);
      }
      uVar51 = (ulong)(iVar64 + 1U);
    } while (uVar45 != iVar64 + 1U);
    bVar63 = (byte)local_158 & 1;
    bVar54 = (byte)local_1a0 & 1;
  }
  if (local_68._M_string_length == 0) {
    lVar50 = ((long)local_1d8.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_1d8.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    if (lVar50 == 0) {
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize(&local_1d8,2);
      (local_1d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_start)->x = 0.0;
      (local_1d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_start)->y = 0.0;
      (local_1d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_start)->z = 0.0;
      local_1d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[1].x = 0.0;
      local_1d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[1].y = 1.0;
      local_1d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[1].z = 0.0;
    }
    else if (lVar50 == 1) {
      prVar48 = (runtime_error *)__cxa_allocate_exception(0x10);
      _local_208 = (aiVector2t<float>)local_1f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_208,
                 "ParseNode_Geometry3D_Extrusion. Spine must have at least two points.","");
      std::runtime_error::runtime_error(prVar48,(string *)local_208);
      *(undefined ***)prVar48 = &PTR__runtime_error_007fc4b8;
      __cxa_throw(prVar48,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_198.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish ==
        local_198.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl
        .super__Vector_impl_data._M_start) {
      std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::resize(&local_198,5);
      (local_198.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
       super__Vector_impl_data._M_start)->x = 1.0;
      (local_198.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
       super__Vector_impl_data._M_start)->y = 1.0;
      local_198.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[1].x = 1.0;
      local_198.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[1].y = -1.0;
      local_198.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[2].x = -1.0;
      local_198.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[2].y = -1.0;
      local_198.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[3].x = -1.0;
      local_198.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[3].y = 1.0;
      local_198.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[4].x = 1.0;
      local_198.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[4].y = 1.0;
    }
    uVar51 = (long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
    uVar53 = (ulong)((long)uVar51 >> 2) >> 2;
    lVar50 = (long)local_1d8.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_1d8.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2;
    if (uVar53 < (ulong)(lVar50 * -0x5555555555555555)) {
      if (uVar53 == 1) {
        local_208 = (undefined1  [4])
                    local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start[0];
        fStack_204 = local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[1];
        aStack_200 = *(aiVector2t<float> *)
                      ((long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start + 8);
      }
      else {
        local_208 = (undefined1  [4])0x0;
        fStack_204 = 0.0;
        aStack_200.x = 1.0;
        aStack_200.y = 0.0;
      }
      local_158 = CONCAT71(local_158._1_7_,bVar63);
      local_1a0 = CONCAT71(local_1a0._1_7_,bVar54);
      std::vector<float,_std::allocator<float>_>::reserve(&local_1b8,lVar50 * -0x5555555555555554);
      lVar50 = ((long)local_1d8.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_1d8.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 - uVar53;
      if (lVar50 != 0) {
        do {
          if (local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)&local_1b8,
                       (iterator)
                       local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,(float *)local_208);
          }
          else {
            *local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = (float)local_208;
            local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          if (local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)&local_1b8,
                       (iterator)
                       local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,(float *)(local_208 + 4));
          }
          else {
            *local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = fStack_204;
            local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          if (local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)&local_1b8,
                       (iterator)
                       local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,&aStack_200.x);
          }
          else {
            *local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = aStack_200.x;
            local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          if (local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)&local_1b8,
                       (iterator)
                       local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,&aStack_200.y);
          }
          else {
            *local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = aStack_200.y;
            local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          lVar50 = lVar50 + -1;
        } while (lVar50 != 0);
      }
      uVar51 = (long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
      bVar63 = (byte)local_158;
      bVar54 = (byte)local_1a0;
    }
    if ((uVar51 & 0xc) != 0) {
      prVar48 = (runtime_error *)__cxa_allocate_exception(0x10);
      _local_208 = (aiVector2t<float>)local_1f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_208,
                 "Attribute \"orientation\" in <Extrusion> must has multiple four quantity of numbers."
                 ,"");
      std::runtime_error::runtime_error(prVar48,(string *)local_208);
      *(undefined ***)prVar48 = &PTR__runtime_error_007fc4b8;
      __cxa_throw(prVar48,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar51 = ((long)local_1d8.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_1d8.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    if ((ulong)((long)local_128.
                      super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_128.
                      super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) < uVar51) {
      if ((long)local_128.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_128.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 8) {
        _local_208 = *local_128.
                      super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start;
      }
      else {
        local_208 = (undefined1  [4])0x3f800000;
        fStack_204 = 1.0;
      }
      std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::reserve
                (&local_128,uVar51);
      lVar50 = ((long)local_1d8.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_1d8.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 -
               ((long)local_128.
                      super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_128.
                      super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3);
      if (lVar50 != 0) {
        do {
          if (local_128.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_128.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector2t<float>,std::allocator<aiVector2t<float>>>::
            _M_realloc_insert<aiVector2t<float>const&>
                      ((vector<aiVector2t<float>,std::allocator<aiVector2t<float>>> *)&local_128,
                       (iterator)
                       local_128.
                       super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(aiVector2t<float> *)local_208);
          }
          else {
            *local_128.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish = _local_208;
            local_128.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_128.
                 super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          lVar50 = lVar50 + -1;
        } while (lVar50 != 0);
      }
    }
    pXVar43 = local_178;
    local_168 = (CX3DImporter_NodeElement *)operator_new(0xf0);
    pCVar37 = pXVar43->NodeElement_Cur;
    local_168->Type = ENET_Extrusion;
    (local_168->ID)._M_dataplus._M_p = (pointer)&(local_168->ID).field_2;
    (local_168->ID)._M_string_length = 0;
    (local_168->ID).field_2._M_local_buf[0] = '\0';
    local_168->Parent = pCVar37;
    (local_168->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_168->Child;
    (local_168->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_168->Child;
    (local_168->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    *(CX3DImporter_NodeElement **)&local_168[1].Type = local_168 + 1;
    local_168[1]._vptr_CX3DImporter_NodeElement = (_func_int **)(local_168 + 1);
    local_168[1].ID._M_dataplus._M_p = (pointer)0x0;
    local_168[1].ID._M_string_length = 0;
    local_168[1].ID.field_2._M_local_buf[0] = '\x01';
    local_168->_vptr_CX3DImporter_NodeElement =
         (_func_int **)&PTR__CX3DImporter_NodeElement_IndexedSet_008ca8e0;
    *(undefined8 *)((long)&local_168[1].ID.field_2 + 8) = 0;
    local_168[1].Parent = (CX3DImporter_NodeElement *)0x0;
    local_168[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    local_168[1].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    local_168[2]._vptr_CX3DImporter_NodeElement = (_func_int **)0x0;
    *(undefined8 *)&local_168[2].Type = 0;
    local_168[2].ID._M_string_length = 0;
    local_168[2].ID.field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&local_168[2].ID.field_2 + 8) = 0;
    local_168[2].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    local_168[2].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    local_168[2].Child.
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    if (local_88._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&local_168->ID);
    }
    pCVar37 = local_168;
    local_148.super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>._M_impl
    .super__Vector_impl_data._0_16_ = ZEXT816(0);
    local_168[1].ID.field_2._M_local_buf[1] = (byte)local_170 & 1;
    *(byte *)((long)&local_168[1].Child.
                     super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                     ._M_impl._M_node.super__List_node_base._M_prev + 1) = bVar63;
    *(float *)&local_168[2].ID._M_dataplus._M_p = local_108;
    local_168[1].ID.field_2._M_local_buf[0] = bVar54;
    local_148.super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a0 = 0;
    local_c8 = (pointer)0x0;
    uVar51 = (long)local_198.
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_198.
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    if (3 < uVar51) {
      uVar53 = 3;
      do {
        uVar58 = uVar53 + 1;
        if (((local_198.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start)->x ==
             local_198.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar53].x) &&
           (!NAN((local_198.
                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start)->x) &&
            !NAN(local_198.
                 super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar53].x))) {
          if (((local_198.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->y ==
               local_198.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar53].y) &&
             (pfVar55 = &local_198.
                         super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[1].y, uVar42 = uVar58,
             !NAN((local_198.
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start)->y) &&
             !NAN(local_198.
                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar53].y))) {
            while( true ) {
              if (uVar51 <= uVar42) {
                local_1a0 = CONCAT71((int7)((long)local_198.
                                                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_198.
                                                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 0xb),
                                     1);
                if (local_198.
                    super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar53 !=
                    local_198.
                    super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  local_198.
                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish =
                       local_198.
                       super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar53;
                }
                goto LAB_006897d0;
              }
              if ((((aiVector2t<float> *)(pfVar55 + -1))->x !=
                   local_198.
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar42].x) ||
                 (NAN(((aiVector2t<float> *)(pfVar55 + -1))->x) ||
                  NAN(local_198.
                      super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar42].x))) break;
              if ((*pfVar55 !=
                   local_198.
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar42].y) ||
                 (NAN(*pfVar55) ||
                  NAN(local_198.
                      super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar42].y))) break;
              pfVar55 = pfVar55 + 2;
              uVar42 = uVar42 + 1;
            }
          }
        }
        uVar53 = uVar58;
      } while (uVar58 != uVar51);
      local_1a0 = 0;
    }
LAB_006897d0:
    uVar51 = ((long)local_1d8.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_1d8.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    if (3 < uVar51) {
      uVar53 = 3;
      lVar50 = 0x38;
      do {
        if (((local_1d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start)->x ==
             local_1d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar53].x) &&
           (!NAN((local_1d8.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start)->x) &&
            !NAN(local_1d8.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar53].x))) {
          paVar38 = local_1d8.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar53;
          if (((local_1d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->y == paVar38->y) &&
             (!NAN((local_1d8.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start)->y) && !NAN(paVar38->y))) {
            if (((local_1d8.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start)->z == paVar38->z) &&
               (paVar62 = local_1d8.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start, uVar58 = uVar53,
               !NAN((local_1d8.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start)->z) && !NAN(paVar38->z))) {
              while( true ) {
                if (uVar51 <= uVar58 + 1) {
                  local_1dc = (undefined4)
                              CONCAT71((int7)((ulong)local_1d8.
                                                                                                          
                                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 8),1)
                  ;
                  bVar44 = local_20a;
                  if (paVar38 !=
                      local_1d8.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
                    uVar51 = uVar53;
                    local_1d8.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish = paVar38;
                  }
                  goto LAB_006898bb;
                }
                pfVar55 = (float *)((long)paVar62 + lVar50 + -8);
                if (((((paVar62[1].x != *pfVar55) || (NAN(paVar62[1].x) || NAN(*pfVar55))) ||
                     (pfVar55 = (float *)((long)paVar62 + lVar50 + -4), paVar62[1].y != *pfVar55))
                    || ((NAN(paVar62[1].y) || NAN(*pfVar55) ||
                        (pfVar55 = (float *)((long)&paVar62->x + lVar50), paVar62[1].z != *pfVar55))
                       )) || (NAN(paVar62[1].z) || NAN(*pfVar55))) break;
                paVar62 = paVar62 + 1;
                uVar58 = uVar58 + 1;
              }
            }
          }
        }
        uVar53 = uVar53 + 1;
        lVar50 = lVar50 + 0xc;
      } while (uVar53 != uVar51);
    }
    local_1dc = 0;
    bVar44 = false;
LAB_006898bb:
    local_d8 = (undefined1  [16])
               local_148.
               super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
               _M_impl.super__Vector_impl_data._0_16_;
    std::vector<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>::resize
              (&local_148,uVar51);
    if ((long)local_1d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_1d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar50 = ((long)local_1d8.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_1d8.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
      local_108 = 0.0;
      fStack_104 = 0.0;
      fStack_100 = 0.0;
      fStack_fc = 0.0;
      uVar51 = 0;
      local_98._0_4_ = 0.0;
      local_98._4_4_ = 0;
      uStack_90 = 0;
      uStack_8c = 0;
      do {
        lVar59 = (long)local_1d8.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_1d8.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        uVar58 = (lVar59 >> 2) * -0x5555555555555555;
        uVar53 = uVar58 - 1;
        if ((uVar51 == 0) || (uVar53 == uVar51)) {
          if ((char)local_1dc == '\0') {
            if (uVar51 == 0) {
              uVar7 = (local_1d8.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->x;
              uVar24 = (local_1d8.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start)->y;
              uVar8 = local_1d8.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start[1].x;
              uVar25 = local_1d8.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[1].y;
              fVar76 = (float)uVar8 - (float)uVar7;
              fStack_b0 = (float)uVar25 - (float)uVar24;
              pfVar55 = &local_1d8.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[1].z;
              pfVar60 = &(local_1d8.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->z;
            }
            else {
              paVar38 = local_1d8.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar53;
              pfVar55 = &paVar38->z;
              uVar6 = paVar38->x;
              uVar23 = paVar38->y;
              pfVar60 = (float *)((long)local_1d8.
                                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar59 + -0x10);
              uVar18 = *(undefined8 *)
                        ((long)local_1d8.
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar59 + -0x18);
              fVar76 = (float)uVar6 - (float)uVar18;
              fStack_b0 = (float)uVar23 - (float)((ulong)uVar18 >> 0x20);
            }
          }
          else {
            uVar4 = local_1d8.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[1].x;
            uVar21 = local_1d8.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[1].y;
            paVar38 = local_1d8.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar53;
            pfVar60 = &paVar38->z;
            uVar5 = paVar38->x;
            uVar22 = paVar38->y;
            fVar76 = (float)uVar4 - (float)uVar5;
            fStack_b0 = (float)uVar21 - (float)uVar22;
            pfVar55 = &local_1d8.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[1].z;
          }
        }
        else {
          pfVar55 = &local_1d8.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar51 + 1].z;
          uVar2 = local_1d8.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar51 - 1].x;
          uVar19 = local_1d8.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar51 - 1].y;
          uVar3 = local_1d8.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar51 + 1].x;
          uVar20 = local_1d8.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar51 + 1].y;
          fVar76 = (float)uVar3 - (float)uVar2;
          fStack_b0 = (float)uVar20 - (float)uVar19;
          pfVar60 = &local_1d8.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar51 - 1].z;
        }
        local_1bc = *pfVar55 - *pfVar60;
        fVar67 = 1.0 / SQRT(local_1bc * local_1bc + fVar76 * fVar76 + fStack_b0 * fStack_b0);
        if (uVar58 < 3) {
LAB_00689a26:
          fVar72 = 1.0;
          uVar45 = 0;
          uVar73 = 0;
          uVar74 = 0;
          fVar68 = 0.0;
          fVar69 = 0.0;
          fVar70 = 0.0;
          fVar26 = 0.0;
        }
        else {
          if (uVar51 == 0) {
            if ((char)local_1dc == '\0') {
              pfVar60 = &local_1d8.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[2].y;
              uVar58 = 3;
              do {
                fVar72 = ((aiVector3t<float> *)(pfVar60 + -1))->x - pfVar60[-4];
                fVar71 = (float)*(undefined8 *)(pfVar60 + -3);
                fVar75 = (float)((ulong)*(undefined8 *)(pfVar60 + -3) >> 0x20);
                fVar78 = (float)*(undefined8 *)pfVar60 - fVar71;
                fVar26 = (float)((ulong)*(undefined8 *)pfVar60 >> 0x20) - fVar75;
                fVar71 = pfVar60[-6] - fVar71;
                fVar9 = pfVar60[-5] - fVar75;
                fVar77 = pfVar60[-7] - pfVar60[-4];
                fVar68 = fVar78 * fVar9 - fVar71 * fVar26;
                fVar69 = fVar26 * fVar77 - fVar9 * fVar72;
                fVar70 = (0.0 - fVar75) * 0.0 - fVar9 * fVar26;
                fVar26 = (0.0 - fVar75) * 0.0 - fVar9 * fVar26;
                uVar45 = 0;
                uVar73 = 0;
                uVar74 = 0;
                fVar72 = fVar71 * fVar72 - fVar77 * fVar78;
                auVar40._4_4_ = -(uint)(1e-06 < ABS(fVar68));
                auVar40._0_4_ = -(uint)(1e-06 < ABS(fVar68));
                auVar40._8_4_ = -(uint)(1e-06 < ABS(fVar69));
                auVar40._12_4_ = -(uint)(1e-06 < ABS(fVar69));
                uVar66 = movmskpd((int)pfVar55,auVar40);
                pfVar55 = (float *)(ulong)uVar66;
                if (uVar66 != 0) goto LAB_00689ca2;
                if (uVar53 < uVar58) break;
                uVar58 = uVar58 + 1;
                pfVar60 = pfVar60 + 3;
              } while (ABS(fVar72) <= 1e-06);
              if (1e-06 < ABS(fVar72)) goto LAB_00689caa;
              goto LAB_00689a26;
            }
            fVar72 = local_1d8.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[1].x -
                     (local_1d8.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start)->x;
            uVar10 = local_1d8.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[1].y;
            uVar27 = local_1d8.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[1].z;
            uVar11 = (local_1d8.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start)->y;
            uVar28 = (local_1d8.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start)->z;
            fVar26 = (float)uVar27 - (float)uVar28;
            fVar77 = local_1d8.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar53].y - (float)uVar11;
            fVar78 = local_1d8.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar53].z - (float)uVar28;
            fVar9 = local_1d8.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar53].x -
                    (local_1d8.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start)->x;
            fVar68 = ((float)uVar10 - (float)uVar11) * fVar78 - fVar77 * fVar26;
            fVar69 = fVar26 * fVar9 - fVar78 * fVar72;
            fVar70 = (0.0 - (float)uVar28) * 0.0 - fVar78 * fVar26;
            fVar26 = (0.0 - (float)uVar28) * 0.0 - fVar78 * fVar26;
            fVar72 = fVar77 * fVar72 - fVar9 * ((float)uVar10 - (float)uVar11);
          }
          else {
            if (uVar53 == uVar51) {
              fVar72 = (float)local_98;
              uVar45 = local_98._4_4_;
              uVar73 = uStack_90;
              uVar74 = uStack_8c;
              fVar68 = local_108;
              fVar69 = fStack_104;
              fVar70 = fStack_100;
              fVar26 = fStack_fc;
              if ((char)local_1dc == '\0') goto LAB_00689caa;
              fVar72 = local_1d8.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar51].x;
              fVar77 = (local_1d8.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start)->x - fVar72;
              fVar78 = local_1d8.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar51 - 1].y;
              fVar9 = (local_1d8.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->y;
              fVar26 = (local_1d8.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start)->z;
            }
            else {
              fVar72 = local_1d8.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar51].x;
              fVar77 = local_1d8.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar51 + 1].x - fVar72;
              fVar78 = local_1d8.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar51 - 1].y;
              uVar12 = local_1d8.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar51 + 1].y;
              uVar29 = local_1d8.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar51 + 1].z;
              fVar9 = (float)uVar12;
              fVar26 = (float)uVar29;
            }
            uVar13 = local_1d8.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar51].y;
            uVar30 = local_1d8.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar51].z;
            fVar26 = fVar26 - (float)uVar30;
            fVar71 = local_1d8.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar51 - 1].z - (float)uVar30;
            fVar72 = local_1d8.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar51 - 1].x - fVar72;
            fVar68 = (fVar9 - (float)uVar13) * fVar71 - (fVar78 - (float)uVar13) * fVar26;
            fVar69 = fVar26 * fVar72 - fVar71 * fVar77;
            fVar70 = (0.0 - (float)uVar30) * 0.0 - fVar71 * fVar26;
            fVar26 = (0.0 - (float)uVar30) * 0.0 - fVar71 * fVar26;
            fVar72 = (fVar78 - (float)uVar13) * fVar77 - fVar72 * (fVar9 - (float)uVar13);
            auVar39._4_4_ = -(uint)(ABS(fVar68) <= 1e-06);
            auVar39._0_4_ = -(uint)(ABS(fVar68) <= 1e-06);
            auVar39._8_4_ = -(uint)(ABS(fVar69) <= 1e-06);
            auVar39._12_4_ = -(uint)(ABS(fVar69) <= 1e-06);
            uVar45 = movmskpd((int)local_1d8.
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,auVar39);
            if (((uVar45 & 1) != 0) && ((byte)((byte)uVar45 >> 1) != 0)) {
              uVar45 = 0;
              uVar73 = 0;
              uVar74 = 0;
              if (ABS(fVar72) <= 1e-06) {
                fVar72 = (float)local_98;
                uVar45 = local_98._4_4_;
                uVar73 = uStack_90;
                uVar74 = uStack_8c;
                fVar68 = local_108;
                fVar69 = fStack_104;
                fVar70 = fStack_100;
                fVar26 = fStack_fc;
              }
              goto LAB_00689caa;
            }
          }
LAB_00689ca2:
          uVar74 = 0;
          uVar73 = 0;
          uVar45 = 0;
        }
LAB_00689caa:
        fVar76 = fVar76 * fVar67;
        fVar78 = fStack_b0 * fVar67;
        local_1bc = local_1bc * fVar67;
        fVar67 = (float)local_98 * fVar72 + fStack_104 * fVar69 + fVar68 * local_108;
        if (fVar67 < 0.0) {
          fVar72 = -fVar72;
          uVar45 = uVar45 ^ 0x80000000;
          uVar73 = uVar73 ^ 0x80000000;
          uVar74 = uVar74 ^ 0x80000000;
        }
        uVar66 = (uint)(fVar67 < 0.0);
        uVar65 = (int)(uVar66 << 0x1f) >> 0x1f;
        uVar66 = (int)(uVar66 << 0x1f) >> 0x1f;
        local_108 = (float)((uint)-fVar68 & uVar65 | ~uVar65 & (uint)fVar68);
        fStack_150 = (float)((uint)-fVar69 & uVar66 | ~uVar66 & (uint)fVar69);
        fStack_fc = 1.0 / SQRT(fVar72 * fVar72 + local_108 * local_108 + fStack_150 * fStack_150);
        fVar72 = fVar72 * fStack_fc;
        local_98 = CONCAT44(uVar45,fVar72);
        local_108 = fStack_fc * local_108;
        fStack_150 = fStack_fc * fStack_150;
        fStack_100 = fStack_fc * fVar70;
        fStack_fc = fStack_fc * fVar26;
        local_158 = CONCAT44(fStack_150,fStack_150);
        local_48 = fVar78 * fVar72 - fStack_150 * local_1bc;
        local_dc = local_1bc * local_108 - fVar72 * fVar76;
        fVar67 = fVar76 * fStack_150 - local_108 * fVar78;
        fVar72 = 1.0 / SQRT(fVar67 * fVar67 + local_48 * local_48 + local_dc * local_dc);
        local_48 = local_48 * fVar72;
        local_dc = local_dc * fVar72;
        local_f8 = CONCAT44(local_f8._4_4_,fVar72 * fVar67);
        local_f0 = ((aiVector2t<float> *)
                   ((long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start + (uVar51 * 2 + 1) * 8))->y;
        local_e8 = ((aiVector2t<float> *)
                   ((long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar51 * 2 * 8))->x;
        local_e0 = ((aiVector2t<float> *)
                   ((long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar51 * 2 * 8))->y;
        local_e4 = ((aiVector2t<float> *)
                   ((long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start + (uVar51 * 2 + 1) * 8))->x;
        local_a8 = CONCAT44(fStack_b0,fVar76);
        uStack_a0 = 0;
        local_b8 = CONCAT44(fStack_b0,fVar78);
        fStack_14c = fStack_150;
        fStack_ac = fStack_b0;
        uStack_90 = uVar73;
        uStack_8c = uVar74;
        fStack_44 = fStack_b0;
        fStack_40 = fStack_b0;
        fStack_3c = fStack_b0;
        fStack_104 = fStack_150;
        local_ec = cosf(local_f0);
        fVar76 = sinf(local_f0);
        fVar72 = 1.0 - local_ec;
        fVar68 = local_e8 * fVar72;
        fVar78 = fVar68 * local_e0 - local_e4 * fVar76;
        fVar70 = fVar68 * local_e0 + local_e4 * fVar76;
        fVar67 = fVar68 * local_e4 + local_e0 * fVar76;
        fVar69 = fVar68 * local_e4 - local_e0 * fVar76;
        fVar9 = local_e0 * fVar72 * local_e4;
        fVar26 = fVar9 - local_e8 * fVar76;
        fVar9 = fVar9 + local_e8 * fVar76;
        fVar68 = fVar68 * local_e8 + local_ec;
        fVar77 = local_e0 * local_e0 * fVar72 + local_ec;
        fVar76 = fVar72 * local_e4 * local_e4 + local_ec;
        local_148.super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar51].a1 =
             fVar67 * (float)local_f8 + fVar68 * local_48 + fVar78 * local_dc + 0.0;
        local_148.super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar51].a2 =
             fVar26 * (float)local_f8 + fVar70 * local_48 + fVar77 * local_dc + 0.0;
        local_148.super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar51].a3 =
             (float)local_f8 * fVar76 + local_48 * fVar69 + local_dc * fVar9 + 0.0;
        local_148.super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar51].b1 =
             fVar67 * local_1bc + fVar68 * (float)local_a8 + (float)local_b8 * fVar78 + 0.0;
        local_148.super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar51].b2 =
             fVar26 * local_1bc + fVar70 * (float)local_a8 + (float)local_b8 * fVar77 + 0.0;
        local_148.super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar51].b3 =
             local_1bc * fVar76 + (float)local_a8 * fVar69 + (float)local_b8 * fVar9 + 0.0;
        local_148.super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar51].c1 =
             fVar67 * (float)local_98 + fVar68 * local_108 + fVar78 * (float)local_158 + 0.0;
        local_148.super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar51].c2 =
             fVar26 * (float)local_98 + fVar70 * local_108 + fVar77 * (float)local_158 + 0.0;
        local_148.super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar51].c3 =
             fVar76 * (float)local_98 + fVar69 * local_108 + fVar9 * (float)local_158 + 0.0;
        uVar51 = uVar51 + 1;
      } while (uVar51 != lVar50 + (ulong)(lVar50 == 0));
    }
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_208,
               (long)local_198.
                     super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_198.
                     super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3,&local_159);
    std::
    vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
    ::resize((vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
              *)local_d8,
             ((long)local_1d8.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_1d8.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555);
    if ((long)local_1d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_1d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar59 = ((long)local_1d8.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_1d8.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
      lVar50 = 0;
      do {
        if ((long)local_198.
                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_198.
                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start != 0) {
          lVar49 = (long)local_198.
                         super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_198.
                         super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3;
          fVar76 = local_128.
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar50].y;
          fVar67 = local_128.
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar50].x;
          lVar56 = 0;
          lVar61 = 0;
          do {
            fVar72 = local_198.
                     super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar61].y;
            fVar69 = local_198.
                     super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar61].x * 0.0 + 0.0;
            fVar68 = fVar72 * 0.0;
            *(ulong *)((long)_local_208 + lVar56) =
                 CONCAT44(fVar69 + fVar68 + 0.0,
                          local_198.
                          super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar61].x * fVar67 + 0.0 +
                          fVar68 + 0.0);
            *(float *)((undefined1 *)((long)_local_208 + 8) + lVar56) =
                 fVar76 * fVar72 + fVar69 + 0.0;
            fVar72 = *(float *)((long)_local_208 + lVar56);
            fVar68 = local_148.
                     super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar50].a3;
            fVar78 = (float)*(undefined8 *)((undefined1 *)((long)_local_208 + 4) + lVar56);
            fVar9 = (float)((ulong)*(undefined8 *)((undefined1 *)((long)_local_208 + 4) + lVar56) >>
                           0x20);
            fVar69 = local_148.
                     super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar50].c3;
            fVar70 = local_148.
                     super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar50].b3;
            uVar14 = local_148.
                     super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar50].a1;
            uVar31 = local_148.
                     super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar50].a2;
            uVar15 = local_148.
                     super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar50].b1;
            uVar32 = local_148.
                     super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar50].b2;
            uVar16 = local_148.
                     super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar50].c1;
            uVar33 = local_148.
                     super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar50].c2;
            uVar17 = local_1d8.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar50].x;
            uVar34 = local_1d8.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar50].y;
            fVar26 = local_1d8.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar50].z;
            *(ulong *)((long)_local_208 + lVar56) =
                 CONCAT44((float)uVar34 +
                          fVar9 * (float)uVar33 + fVar78 * (float)uVar32 + (float)uVar31 * fVar72,
                          (float)uVar17 +
                          fVar9 * (float)uVar16 + fVar78 * (float)uVar15 + (float)uVar14 * fVar72);
            *(float *)((undefined1 *)((long)_local_208 + 8) + lVar56) =
                 fVar69 * fVar9 + fVar68 * fVar72 + fVar70 * fVar78 + fVar26;
            lVar61 = lVar61 + 1;
            lVar56 = lVar56 + 0xc;
          } while (lVar49 + (ulong)(lVar49 == 0) != lVar61);
        }
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator=
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                   (local_d8._0_8_ + lVar50 * 0x18),
                   (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_208);
        lVar50 = lVar50 + 1;
      } while (lVar50 != lVar59 + (ulong)(lVar59 == 0));
    }
    if (_local_208 != (aiVector2t<float>)0x0) {
      operator_delete((void *)_local_208);
    }
    if (bVar44 != false || local_209 != false) {
      if ((long)local_198.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_198.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0) {
        lVar59 = (long)local_198.
                       super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_198.
                       super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        lVar50 = 0;
        do {
          local_208 = (undefined1  [4])(float)lVar50;
          iVar57._M_current = (int *)pCVar37[2]._vptr_CX3DImporter_NodeElement;
          if (iVar57._M_current == *(int **)&pCVar37[2].Type) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)
                       &pCVar37[1].Child.
                        super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                        ._M_impl._M_node._M_size,iVar57,(int *)local_208);
          }
          else {
            *iVar57._M_current = (int)(float)lVar50;
            pCVar37[2]._vptr_CX3DImporter_NodeElement =
                 (_func_int **)((long)pCVar37[2]._vptr_CX3DImporter_NodeElement + 4);
          }
          lVar50 = lVar50 + 1;
        } while (lVar59 + (ulong)(lVar59 == 0) != lVar50);
      }
      local_208 = (undefined1  [4])0xffffffff;
      iVar57._M_current = (int *)pCVar37[2]._vptr_CX3DImporter_NodeElement;
      if (iVar57._M_current == *(int **)&pCVar37[2].Type) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)
                   &pCVar37[1].Child.
                    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                    ._M_impl._M_node._M_size,iVar57,(int *)local_208);
      }
      else {
        *iVar57._M_current = -1;
        pCVar37[2]._vptr_CX3DImporter_NodeElement =
             (_func_int **)((long)pCVar37[2]._vptr_CX3DImporter_NodeElement + 4);
      }
    }
    if (((char)local_1dc == '\0') && (local_20a != false)) {
      lVar50 = ((long)(local_d8._8_8_ - local_d8._0_8_) >> 3) * -0x5555555555555555;
      lVar59 = (long)local_198.
                     super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_198.
                     super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3;
      if ((ulong)((lVar50 + -1) * lVar59) < (ulong)(lVar59 * lVar50)) {
        fVar76 = (float)((int)lVar59 * ((int)lVar50 + -1));
        do {
          local_208 = (undefined1  [4])fVar76;
          iVar57._M_current = (int *)pCVar37[2]._vptr_CX3DImporter_NodeElement;
          if (iVar57._M_current == *(int **)&pCVar37[2].Type) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)
                       &pCVar37[1].Child.
                        super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                        ._M_impl._M_node._M_size,iVar57,(int *)local_208);
          }
          else {
            *iVar57._M_current = (int)fVar76;
            pCVar37[2]._vptr_CX3DImporter_NodeElement =
                 (_func_int **)((long)pCVar37[2]._vptr_CX3DImporter_NodeElement + 4);
          }
          fVar76 = (float)((int)fVar76 + 1);
          lVar59 = lVar59 + -1;
        } while (lVar59 != 0);
      }
      local_208 = (undefined1  [4])0xffffffff;
      iVar57._M_current = (int *)pCVar37[2]._vptr_CX3DImporter_NodeElement;
      if (iVar57._M_current == *(int **)&pCVar37[2].Type) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)
                   &pCVar37[1].Child.
                    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                    ._M_impl._M_node._M_size,iVar57,(int *)local_208);
      }
      else {
        *iVar57._M_current = -1;
        pCVar37[2]._vptr_CX3DImporter_NodeElement =
             (_func_int **)((long)pCVar37[2]._vptr_CX3DImporter_NodeElement + 4);
      }
    }
    local_f8 = ((long)local_1d8.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_1d8.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555 - 1;
    psVar1 = &pCVar37[1].Child.
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    uVar51 = 0;
    do {
      iVar46 = (int)uVar51;
      local_b8 = uVar51;
      if (uVar51 == local_f8) {
        if ((char)local_1dc == '\0') break;
        iVar64 = 0;
      }
      else {
        iVar64 = iVar46 + 1;
      }
      if (local_198.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_198.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        lVar50 = (long)local_198.
                       super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_198.
                       super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        iVar41 = (int)lVar50;
        local_1bc = (float)(iVar41 * iVar46);
        local_108 = (float)(iVar64 * iVar41);
        local_158 = -(ulong)(lVar50 == 0) - lVar50;
        local_a8 = CONCAT44(local_a8._4_4_,iVar41 + -1 + (int)local_108);
        local_98 = (ulong)(uint)(iVar41 + -1 + (int)local_1bc);
        fVar67 = (float)(iVar41 * iVar46);
        fStack_104 = 0.0;
        uVar51 = 0;
        fVar76 = local_108;
        do {
          if (-uVar51 == lVar50 + -1) {
            if ((byte)local_1a0 != '\0') {
              if ((local_170 & 1) == 0) {
                local_208 = (undefined1  [4])local_1bc;
                iVar57._M_current = (int *)pCVar37[2]._vptr_CX3DImporter_NodeElement;
                if (iVar57._M_current == *(int **)&pCVar37[2].Type) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            ((vector<int,_std::allocator<int>_> *)psVar1,iVar57,(int *)local_208);
                  iVar57._M_current = (int *)pCVar37[2]._vptr_CX3DImporter_NodeElement;
                }
                else {
                  *iVar57._M_current = (int)local_1bc;
                  iVar57._M_current = (int *)((long)pCVar37[2]._vptr_CX3DImporter_NodeElement + 4);
                  pCVar37[2]._vptr_CX3DImporter_NodeElement = (_func_int **)iVar57._M_current;
                }
                local_208 = (undefined1  [4])local_108;
                if (iVar57._M_current == *(int **)&pCVar37[2].Type) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            ((vector<int,_std::allocator<int>_> *)psVar1,iVar57,(int *)local_208);
                  iVar57._M_current = (int *)pCVar37[2]._vptr_CX3DImporter_NodeElement;
                }
                else {
                  *iVar57._M_current = (int)local_108;
                  iVar57._M_current = (int *)((long)pCVar37[2]._vptr_CX3DImporter_NodeElement + 4);
                  pCVar37[2]._vptr_CX3DImporter_NodeElement = (_func_int **)iVar57._M_current;
                }
                local_208 = (undefined1  [4])(float)local_a8;
                if (iVar57._M_current == *(int **)&pCVar37[2].Type) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            ((vector<int,_std::allocator<int>_> *)psVar1,iVar57,(int *)local_208);
                  iVar57._M_current = (int *)pCVar37[2]._vptr_CX3DImporter_NodeElement;
                }
                else {
                  *iVar57._M_current = (int)(float)local_a8;
                  iVar57._M_current = (int *)((long)pCVar37[2]._vptr_CX3DImporter_NodeElement + 4);
                  pCVar37[2]._vptr_CX3DImporter_NodeElement = (_func_int **)iVar57._M_current;
                }
                local_208 = (undefined1  [4])(float)local_98;
                if (iVar57._M_current != *(int **)&pCVar37[2].Type) {
                  *iVar57._M_current = (int)(float)local_98;
                  goto LAB_0068a9f6;
                }
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)psVar1,iVar57,(int *)local_208);
              }
              else {
                local_208 = SUB84(local_98,0);
                iVar57._M_current = (int *)pCVar37[2]._vptr_CX3DImporter_NodeElement;
                if (iVar57._M_current == *(int **)&pCVar37[2].Type) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            ((vector<int,_std::allocator<int>_> *)psVar1,iVar57,(int *)local_208);
                  iVar57._M_current = (int *)pCVar37[2]._vptr_CX3DImporter_NodeElement;
                }
                else {
                  *iVar57._M_current = (int)local_208;
                  iVar57._M_current = (int *)((long)pCVar37[2]._vptr_CX3DImporter_NodeElement + 4);
                  pCVar37[2]._vptr_CX3DImporter_NodeElement = (_func_int **)iVar57._M_current;
                }
                local_208 = (undefined1  [4])(float)local_a8;
                if (iVar57._M_current == *(int **)&pCVar37[2].Type) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            ((vector<int,_std::allocator<int>_> *)psVar1,iVar57,(int *)local_208);
                  iVar57._M_current = (int *)pCVar37[2]._vptr_CX3DImporter_NodeElement;
                }
                else {
                  *iVar57._M_current = (int)(float)local_a8;
                  iVar57._M_current = (int *)((long)pCVar37[2]._vptr_CX3DImporter_NodeElement + 4);
                  pCVar37[2]._vptr_CX3DImporter_NodeElement = (_func_int **)iVar57._M_current;
                }
                local_208 = (undefined1  [4])local_108;
                if (iVar57._M_current == *(int **)&pCVar37[2].Type) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            ((vector<int,_std::allocator<int>_> *)psVar1,iVar57,(int *)local_208);
                  iVar57._M_current = (int *)pCVar37[2]._vptr_CX3DImporter_NodeElement;
                }
                else {
                  *iVar57._M_current = (int)local_108;
                  iVar57._M_current = (int *)((long)pCVar37[2]._vptr_CX3DImporter_NodeElement + 4);
                  pCVar37[2]._vptr_CX3DImporter_NodeElement = (_func_int **)iVar57._M_current;
                }
                local_208 = (undefined1  [4])local_1bc;
                if (iVar57._M_current == *(int **)&pCVar37[2].Type) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            ((vector<int,_std::allocator<int>_> *)psVar1,iVar57,(int *)local_208);
                }
                else {
                  *iVar57._M_current = (int)local_1bc;
LAB_0068a9f6:
                  pCVar37[2]._vptr_CX3DImporter_NodeElement =
                       (_func_int **)((long)pCVar37[2]._vptr_CX3DImporter_NodeElement + 4);
                }
              }
              local_208 = (undefined1  [4])0xffffffff;
              iVar57._M_current = (int *)pCVar37[2]._vptr_CX3DImporter_NodeElement;
              if (iVar57._M_current != *(int **)&pCVar37[2].Type) goto LAB_0068aa37;
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)psVar1,iVar57,(int *)local_208);
            }
          }
          else {
            if ((local_170 & 1) == 0) {
              local_208 = (undefined1  [4])((int)fVar67 + 1);
              iVar57._M_current = (int *)pCVar37[2]._vptr_CX3DImporter_NodeElement;
              if (iVar57._M_current == *(int **)&pCVar37[2].Type) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)psVar1,iVar57,(int *)local_208);
                iVar57._M_current = (int *)pCVar37[2]._vptr_CX3DImporter_NodeElement;
              }
              else {
                *iVar57._M_current = (int)local_208;
                iVar57._M_current = (int *)((long)pCVar37[2]._vptr_CX3DImporter_NodeElement + 4);
                pCVar37[2]._vptr_CX3DImporter_NodeElement = (_func_int **)iVar57._M_current;
              }
              local_208 = (undefined1  [4])((int)fVar76 + 1);
              if (iVar57._M_current == *(int **)&pCVar37[2].Type) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)psVar1,iVar57,(int *)local_208);
                iVar57._M_current = (int *)pCVar37[2]._vptr_CX3DImporter_NodeElement;
              }
              else {
                *iVar57._M_current = (int)local_208;
                iVar57._M_current = (int *)((long)pCVar37[2]._vptr_CX3DImporter_NodeElement + 4);
                pCVar37[2]._vptr_CX3DImporter_NodeElement = (_func_int **)iVar57._M_current;
              }
              if (iVar57._M_current == *(int **)&pCVar37[2].Type) {
                local_208 = (undefined1  [4])fVar76;
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)psVar1,iVar57,(int *)local_208);
                iVar57._M_current = (int *)pCVar37[2]._vptr_CX3DImporter_NodeElement;
              }
              else {
                *iVar57._M_current = (int)fVar76;
                iVar57._M_current = (int *)((long)pCVar37[2]._vptr_CX3DImporter_NodeElement + 4);
                pCVar37[2]._vptr_CX3DImporter_NodeElement = (_func_int **)iVar57._M_current;
              }
              local_208 = (undefined1  [4])fVar67;
              if (iVar57._M_current != *(int **)&pCVar37[2].Type) {
                *iVar57._M_current = (int)fVar67;
                goto LAB_0068a83d;
              }
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)psVar1,iVar57,(int *)local_208);
            }
            else {
              iVar57._M_current = (int *)pCVar37[2]._vptr_CX3DImporter_NodeElement;
              if (iVar57._M_current == *(int **)&pCVar37[2].Type) {
                local_208 = (undefined1  [4])fVar67;
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)psVar1,iVar57,(int *)local_208);
                iVar57._M_current = (int *)pCVar37[2]._vptr_CX3DImporter_NodeElement;
              }
              else {
                *iVar57._M_current = (int)fVar67;
                iVar57._M_current = (int *)((long)pCVar37[2]._vptr_CX3DImporter_NodeElement + 4);
                pCVar37[2]._vptr_CX3DImporter_NodeElement = (_func_int **)iVar57._M_current;
              }
              if (iVar57._M_current == *(int **)&pCVar37[2].Type) {
                local_208 = (undefined1  [4])fVar76;
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)psVar1,iVar57,(int *)local_208);
                iVar57._M_current = (int *)pCVar37[2]._vptr_CX3DImporter_NodeElement;
              }
              else {
                *iVar57._M_current = (int)fVar76;
                iVar57._M_current = (int *)((long)pCVar37[2]._vptr_CX3DImporter_NodeElement + 4);
                pCVar37[2]._vptr_CX3DImporter_NodeElement = (_func_int **)iVar57._M_current;
              }
              local_208 = (undefined1  [4])((int)fVar76 + 1);
              if (iVar57._M_current == *(int **)&pCVar37[2].Type) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)psVar1,iVar57,(int *)local_208);
                iVar57._M_current = (int *)pCVar37[2]._vptr_CX3DImporter_NodeElement;
              }
              else {
                *iVar57._M_current = (int)local_208;
                iVar57._M_current = (int *)((long)pCVar37[2]._vptr_CX3DImporter_NodeElement + 4);
                pCVar37[2]._vptr_CX3DImporter_NodeElement = (_func_int **)iVar57._M_current;
              }
              local_208 = (undefined1  [4])((int)fVar67 + 1);
              if (iVar57._M_current == *(int **)&pCVar37[2].Type) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          ((vector<int,_std::allocator<int>_> *)psVar1,iVar57,(int *)local_208);
              }
              else {
                *iVar57._M_current = (int)fVar67 + 1;
LAB_0068a83d:
                pCVar37[2]._vptr_CX3DImporter_NodeElement =
                     (_func_int **)((long)pCVar37[2]._vptr_CX3DImporter_NodeElement + 4);
              }
            }
            local_208 = (undefined1  [4])0xffffffff;
            iVar57._M_current = (int *)pCVar37[2]._vptr_CX3DImporter_NodeElement;
            if (iVar57._M_current == *(int **)&pCVar37[2].Type) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        ((vector<int,_std::allocator<int>_> *)psVar1,iVar57,(int *)local_208);
            }
            else {
LAB_0068aa37:
              *iVar57._M_current = -1;
              pCVar37[2]._vptr_CX3DImporter_NodeElement =
                   (_func_int **)((long)pCVar37[2]._vptr_CX3DImporter_NodeElement + 4);
            }
          }
          uVar51 = uVar51 - 1;
          fVar76 = (float)((int)fVar76 + 1);
          fVar67 = (float)((int)fVar67 + 1);
        } while (local_158 != uVar51);
      }
      uVar51 = local_b8 + 1;
    } while (uVar51 <= local_f8);
    if ((long)local_1d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_1d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar50 = ((long)local_1d8.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_1d8.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
      local_170 = lVar50 + (ulong)(lVar50 == 0);
      local_158 = 0;
      do {
        uVar51 = local_158;
        if ((long)local_198.
                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_198.
                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start != 0) {
          lVar50 = (long)local_198.
                         super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_198.
                         super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3;
          lVar50 = lVar50 + (ulong)(lVar50 == 0);
          lVar59 = 0;
          do {
            paVar38 = (((pointer)(local_d8._0_8_ + uVar51 * 0x18))->
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            p_Var47 = (_List_node_base *)operator_new(0x20);
            *(undefined4 *)&p_Var47[1]._M_prev = *(undefined4 *)((long)&paVar38->z + lVar59);
            p_Var47[1]._M_next = *(_List_node_base **)((long)&paVar38->x + lVar59);
            std::__detail::_List_node_base::_M_hook(p_Var47);
            pCVar37[1].ID._M_dataplus._M_p = pCVar37[1].ID._M_dataplus._M_p + 1;
            lVar59 = lVar59 + 0xc;
            lVar50 = lVar50 + -1;
          } while (lVar50 != 0);
        }
        local_158 = local_158 + 1;
      } while (local_158 != local_170);
    }
    iVar46 = (*(((local_178->mReader)._M_t.
                 super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                 super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
               super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar37 = local_168;
    if ((char)iVar46 == '\0') {
      _local_208 = (aiVector2t<float>)local_1f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"Extrusion","");
      ParseNode_Metadata(local_178,pCVar37,(string *)local_208);
      if (_local_208 != (aiVector2t<float>)local_1f8) {
        operator_delete((void *)_local_208);
      }
    }
    else {
      pCVar37 = local_178->NodeElement_Cur;
      p_Var47 = (_List_node_base *)operator_new(0x18);
      p_Var47[1]._M_next = (_List_node_base *)local_168;
      std::__detail::_List_node_base::_M_hook(p_Var47);
      psVar1 = &(pCVar37->Child).
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    p_Var47 = (_List_node_base *)operator_new(0x18);
    pXVar43 = local_178;
    p_Var47[1]._M_next = (_List_node_base *)local_168;
    std::__detail::_List_node_base::_M_hook(p_Var47);
    psVar1 = &(pXVar43->NodeElement_List).
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    std::
    vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
    ::~vector((vector<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>,_std::allocator<std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>_>
               *)local_d8);
    if (local_148.super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_148.
                      super__Vector_base<aiMatrix3x3t<float>,_std::allocator<aiMatrix3x3t<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (local_88._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar44 = FindNodeElement(this,&local_68,ENET_Extrusion,&local_168);
    if (!bVar44) {
      Throw_USE_NotFound(this,&local_68);
    }
    pCVar37 = this->NodeElement_Cur;
    p_Var47 = (_List_node_base *)operator_new(0x18);
    p_Var47[1]._M_next = (_List_node_base *)local_168;
    std::__detail::_List_node_base::_M_hook(p_Var47);
    psVar1 = &(pCVar37->Child).
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  if (local_1d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_128.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (aiVector2t<float> *)0x0) {
    operator_delete(local_128.
                    super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((aiVector2t<float> *)
      local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (aiVector2t<float> *)0x0) {
    operator_delete(local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_198.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.
                    super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Geometry3D_Extrusion()
{
    std::string use, def;
    bool beginCap = true;
    bool ccw = true;
    bool convex = true;
    float creaseAngle = 0;
    std::vector<aiVector2D> crossSection;
    bool endCap = true;
    std::vector<float> orientation;
    std::vector<aiVector2D> scale;
    bool solid = true;
    std::vector<aiVector3D> spine;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("beginCap", beginCap, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("ccw", ccw, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("convex", convex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("creaseAngle", creaseAngle, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_REF("crossSection", crossSection, XML_ReadNode_GetAttrVal_AsArrVec2f);
		MACRO_ATTRREAD_CHECK_RET("endCap", endCap, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_REF("orientation", orientation, XML_ReadNode_GetAttrVal_AsArrF);
		MACRO_ATTRREAD_CHECK_REF("scale", scale, XML_ReadNode_GetAttrVal_AsArrVec2f);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_REF("spine", spine, XML_ReadNode_GetAttrVal_AsArrVec3f);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Extrusion, ne);
	}
	else
	{
		//
		// check if default values must be assigned
		//
		if(spine.size() == 0)
		{
			spine.resize(2);
			spine[0].Set(0, 0, 0), spine[1].Set(0, 1, 0);
		}
		else if(spine.size() == 1)
		{
			throw DeadlyImportError("ParseNode_Geometry3D_Extrusion. Spine must have at least two points.");
		}

		if(crossSection.size() == 0)
		{
			crossSection.resize(5);
			crossSection[0].Set(1, 1), crossSection[1].Set(1, -1), crossSection[2].Set(-1, -1), crossSection[3].Set(-1, 1), crossSection[4].Set(1, 1);
		}

		{// orientation
			size_t ori_size = orientation.size() / 4;

			if(ori_size < spine.size())
			{
				float add_ori[4];// values that will be added

				if(ori_size == 1)// if "orientation" has one element(means one MFRotation with four components) then use it value for all spine points.
				{
					add_ori[0] = orientation[0], add_ori[1] = orientation[1], add_ori[2] = orientation[2], add_ori[3] = orientation[3];
				}
				else// else - use default values
				{
					add_ori[0] = 0, add_ori[1] = 0, add_ori[2] = 1, add_ori[3] = 0;
				}

				orientation.reserve(spine.size() * 4);
				for(size_t i = 0, i_e = (spine.size() - ori_size); i < i_e; i++)
					orientation.push_back(add_ori[0]), orientation.push_back(add_ori[1]), orientation.push_back(add_ori[2]), orientation.push_back(add_ori[3]);
			}

			if(orientation.size() % 4) throw DeadlyImportError("Attribute \"orientation\" in <Extrusion> must has multiple four quantity of numbers.");
		}// END: orientation

		{// scale
			if(scale.size() < spine.size())
			{
				aiVector2D add_sc;

				if(scale.size() == 1)// if "scale" has one element then use it value for all spine points.
					add_sc = scale[0];
				else// else - use default values
					add_sc.Set(1, 1);

				scale.reserve(spine.size());
				for(size_t i = 0, i_e = (spine.size() - scale.size()); i < i_e; i++) scale.push_back(add_sc);
			}
		}// END: scale
		//
		// create and if needed - define new geometry object.
		//
		ne = new CX3DImporter_NodeElement_IndexedSet(CX3DImporter_NodeElement::ENET_Extrusion, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		CX3DImporter_NodeElement_IndexedSet& ext_alias = *((CX3DImporter_NodeElement_IndexedSet*)ne);// create alias for conveience
		// assign part of input data
		ext_alias.CCW = ccw;
		ext_alias.Convex = convex;
		ext_alias.CreaseAngle = creaseAngle;
		ext_alias.Solid = solid;

		//
		// How we done it at all?
		// 1. At first we will calculate array of basises for every point in spine(look SCP in ISO-dic). Also "orientation" vector
		// are applied vor every basis.
		// 2. After that we can create array of point sets: which are scaled, transferred to basis of relative basis and at final translated to real position
		// using relative spine point.
		// 3. Next step is creating CoordIdx array(do not forget "-1" delimiter). While creating CoordIdx also created faces for begin and end caps, if
		// needed. While createing CootdIdx is taking in account CCW flag.
		// 4. The last step: create Vertices list.
		//
        bool spine_closed;// flag: true if spine curve is closed.
        bool cross_closed;// flag: true if cross curve is closed.
        std::vector<aiMatrix3x3> basis_arr;// array of basises. ROW_a - X, ROW_b - Y, ROW_c - Z.
        std::vector<std::vector<aiVector3D> > pointset_arr;// array of point sets: cross curves.

        // detect closed curves
        GeometryHelper_Extrusion_CurveIsClosed(crossSection, true, true, cross_closed);// true - drop tail, true - remove duplicate end.
        GeometryHelper_Extrusion_CurveIsClosed(spine, true, true, spine_closed);// true - drop tail, true - remove duplicate end.
        // If both cap are requested and spine curve is closed then we can make only one cap. Because second cap will be the same surface.
        if(spine_closed)
        {
			beginCap |= endCap;
			endCap = false;
		}

        {// 1. Calculate array of basises.
			aiMatrix4x4 rotmat;
			aiVector3D vecX(0), vecY(0), vecZ(0);

			basis_arr.resize(spine.size());
			for(size_t i = 0, i_e = spine.size(); i < i_e; i++)
			{
				aiVector3D tvec;

				// get axises of basis.
				vecY = GeometryHelper_Extrusion_GetNextY(i, spine, spine_closed);
				vecZ = GeometryHelper_Extrusion_GetNextZ(i, spine, spine_closed, vecZ);
				vecX = (vecY ^ vecZ).Normalize();
				// get rotation matrix and apply "orientation" to basis
				aiMatrix4x4::Rotation(orientation[i * 4 + 3], aiVector3D(orientation[i * 4], orientation[i * 4 + 1], orientation[i * 4 + 2]), rotmat);
				tvec = vecX, tvec *= rotmat, basis_arr[i].a1 = tvec.x, basis_arr[i].a2 = tvec.y, basis_arr[i].a3 = tvec.z;
				tvec = vecY, tvec *= rotmat, basis_arr[i].b1 = tvec.x, basis_arr[i].b2 = tvec.y, basis_arr[i].b3 = tvec.z;
				tvec = vecZ, tvec *= rotmat, basis_arr[i].c1 = tvec.x, basis_arr[i].c2 = tvec.y, basis_arr[i].c3 = tvec.z;
			}// for(size_t i = 0, i_e = spine.size(); i < i_e; i++)
		}// END: 1. Calculate array of basises

		{// 2. Create array of point sets.
			aiMatrix4x4 scmat;
			std::vector<aiVector3D> tcross(crossSection.size());

			pointset_arr.resize(spine.size());
			for(size_t spi = 0, spi_e = spine.size(); spi < spi_e; spi++)
			{
				aiVector3D tc23vec;

				tc23vec.Set(scale[spi].x, 0, scale[spi].y);
				aiMatrix4x4::Scaling(tc23vec, scmat);
				for(size_t cri = 0, cri_e = crossSection.size(); cri < cri_e; cri++)
				{
					aiVector3D tvecX, tvecY, tvecZ;

					tc23vec.Set(crossSection[cri].x, 0, crossSection[cri].y);
					// apply scaling to point
					tcross[cri] = scmat * tc23vec;
					//
					// transfer point to new basis
					// calculate coordinate in new basis
					tvecX.Set(basis_arr[spi].a1, basis_arr[spi].a2, basis_arr[spi].a3), tvecX *= tcross[cri].x;
					tvecY.Set(basis_arr[spi].b1, basis_arr[spi].b2, basis_arr[spi].b3), tvecY *= tcross[cri].y;
					tvecZ.Set(basis_arr[spi].c1, basis_arr[spi].c2, basis_arr[spi].c3), tvecZ *= tcross[cri].z;
					// apply new coordinates and translate it to spine point.
					tcross[cri] = tvecX + tvecY + tvecZ + spine[spi];
				}// for(size_t cri = 0, cri_e = crossSection.size(); cri < cri_e; i++)

				pointset_arr[spi] = tcross;// store transferred point set
			}// for(size_t spi = 0, spi_e = spine.size(); spi < spi_e; i++)
		}// END: 2. Create array of point sets.

		{// 3. Create CoordIdx.
			// add caps if needed
			if(beginCap)
			{
				// add cap as polygon. vertices of cap are places at begin, so just add numbers from zero.
				for(size_t i = 0, i_e = crossSection.size(); i < i_e; i++) ext_alias.CoordIndex.push_back(static_cast<int32_t>(i));

				// add delimiter
				ext_alias.CoordIndex.push_back(-1);
			}// if(beginCap)

			if(endCap)
			{
				// add cap as polygon. vertices of cap are places at end, as for beginCap use just sequence of numbers but with offset.
				size_t beg = (pointset_arr.size() - 1) * crossSection.size();

				for(size_t i = beg, i_e = (beg + crossSection.size()); i < i_e; i++) ext_alias.CoordIndex.push_back(static_cast<int32_t>(i));

				// add delimiter
				ext_alias.CoordIndex.push_back(-1);
			}// if(beginCap)

			// add quads
			for(size_t spi = 0, spi_e = (spine.size() - 1); spi <= spi_e; spi++)
			{
				const size_t cr_sz = crossSection.size();
				const size_t cr_last = crossSection.size() - 1;

				size_t right_col;// hold index basis for points of quad placed in right column;

				if(spi != spi_e)
					right_col = spi + 1;
				else if(spine_closed)// if spine curve is closed then one more quad is needed: between first and last points of curve.
					right_col = 0;
				else
					break;// if spine curve is not closed then break the loop, because spi is out of range for that type of spine.

				for(size_t cri = 0; cri < cr_sz; cri++)
				{
					if(cri != cr_last)
					{
						MACRO_FACE_ADD_QUAD(ccw, ext_alias.CoordIndex,
											static_cast<int32_t>(spi * cr_sz + cri), 
                                            static_cast<int32_t>(right_col * cr_sz + cri), 
                                            static_cast<int32_t>(right_col * cr_sz + cri + 1), 
                                            static_cast<int32_t>(spi * cr_sz + cri + 1));
						// add delimiter
						ext_alias.CoordIndex.push_back(-1);
					}
					else if(cross_closed)// if cross curve is closed then one more quad is needed: between first and last points of curve.
					{
						MACRO_FACE_ADD_QUAD(ccw, ext_alias.CoordIndex,
                                            static_cast<int32_t>(spi * cr_sz + cri), 
                                            static_cast<int32_t>(right_col * cr_sz + cri), 
                                            static_cast<int32_t>(right_col * cr_sz + 0), 
                                            static_cast<int32_t>(spi * cr_sz + 0));
						// add delimiter
						ext_alias.CoordIndex.push_back(-1);
					}
				}// for(size_t cri = 0; cri < cr_sz; cri++)
			}// for(size_t spi = 0, spi_e = (spine.size() - 2); spi < spi_e; spi++)
		}// END: 3. Create CoordIdx.

		{// 4. Create vertices list.
			// just copy all vertices
			for(size_t spi = 0, spi_e = spine.size(); spi < spi_e; spi++)
			{
				for(size_t cri = 0, cri_e = crossSection.size(); cri < cri_e; cri++)
				{
					ext_alias.Vertices.push_back(pointset_arr[spi][cri]);
				}
			}
		}// END: 4. Create vertices list.
//PrintVectorSet("Ext. CoordIdx", ext_alias.CoordIndex);
//PrintVectorSet("Ext. Vertices", ext_alias.Vertices);
		// check for child nodes
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "Extrusion");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}